

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy_visualize.hpp
# Opt level: O0

vector<SphereTree,_std::allocator<SphereTree>_> *
nextlayer(vector<SphereTree,_std::allocator<SphereTree>_> *__return_storage_ptr__,
         vector<SphereTree,_std::allocator<SphereTree>_> *v)

{
  data_t *this;
  bool bVar1;
  reference pSVar2;
  iterator __first;
  iterator __last;
  __normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_> local_80;
  const_iterator local_78;
  undefined1 local_60 [8];
  SphereTree t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SphereTree,_std::allocator<SphereTree>_> *__range1;
  vector<SphereTree,_std::allocator<SphereTree>_> *v_local;
  vector<SphereTree,_std::allocator<SphereTree>_> *cur;
  
  std::vector<SphereTree,_std::allocator<SphereTree>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin(v);
  t.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<SphereTree,_std::allocator<SphereTree>_>::end(v);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                                     *)&t.child.
                                        super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
             ::operator*(&__end1);
    SphereTree::SphereTree((SphereTree *)local_60,pSVar2);
    local_80._M_current =
         (SphereTree *)
         std::vector<SphereTree,_std::allocator<SphereTree>_>::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<SphereTree_const*,std::vector<SphereTree,std::allocator<SphereTree>>>::
    __normal_iterator<SphereTree*>
              ((__normal_iterator<SphereTree_const*,std::vector<SphereTree,std::allocator<SphereTree>>>
                *)&local_78,&local_80);
    this = &t.bound.center.z;
    __first = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin
                        ((vector<SphereTree,_std::allocator<SphereTree>_> *)this);
    __last = std::vector<SphereTree,_std::allocator<SphereTree>_>::end
                       ((vector<SphereTree,_std::allocator<SphereTree>_> *)this);
    std::vector<SphereTree,std::allocator<SphereTree>>::
    insert<__gnu_cxx::__normal_iterator<SphereTree*,std::vector<SphereTree,std::allocator<SphereTree>>>,void>
              ((vector<SphereTree,std::allocator<SphereTree>> *)__return_storage_ptr__,local_78,
               (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                )__first._M_current,
               (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                )__last._M_current);
    SphereTree::~SphereTree((SphereTree *)local_60);
    __gnu_cxx::
    __normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SphereTree> nextlayer(const std::vector<SphereTree>& v)
{
	std::vector<SphereTree> cur;
	for (auto t: v)
		cur.insert(cur.end(), t.child.begin(), t.child.end());
	return cur;
}